

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  pointer pAVar1;
  pointer stats;
  
  pAVar1 = (sectionNode->assertions).
           super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (stats = (sectionNode->assertions).
               super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
               _M_impl.super__Vector_impl_data._M_start; stats != pAVar1; stats = stats + 1) {
    writeAssertion(this,stats);
  }
  return;
}

Assistant:

void writeAssertions(SectionNode const& sectionNode) {
			for (SectionNode::Assertions::const_iterator
				it = sectionNode.assertions.begin(), itEnd = sectionNode.assertions.end();
				it != itEnd;
				++it)
				writeAssertion(*it);
		}